

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

_Bool normalize_forward_slash(char *path,char *dest)

{
  char firstbyte;
  char cVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  
  bVar5 = path != (char *)0x0;
  bVar6 = dest != (char *)0x0;
  if (bVar6 && bVar5) {
    firstbyte = *path;
    if (firstbyte == *G_FORWARD_SLASH_CHAR || firstbyte == *G_BACKSLASH_CHAR) {
      *dest = *G_FORWARD_SLASH_CHAR;
      dest = dest + 1;
      firstbyte = path[1];
      path = path + 1;
    }
    while (firstbyte != '\0') {
      sVar2 = GetUTF8Length(firstbyte);
      pcVar3 = dest;
      pcVar4 = path;
      if (sVar2 < 2) {
        cVar1 = *G_FORWARD_SLASH_CHAR;
        if (firstbyte != *G_BACKSLASH_CHAR) {
          cVar1 = firstbyte;
        }
        path = path + 1;
        *dest = cVar1;
        dest = dest + 1;
      }
      else {
        do {
          path = pcVar4 + 1;
          dest = pcVar3 + 1;
          *pcVar3 = *pcVar4;
          sVar2 = sVar2 - 1;
          pcVar3 = dest;
          pcVar4 = path;
        } while (sVar2 != 0);
      }
      firstbyte = *path;
    }
    *dest = '\0';
  }
  return bVar6 && bVar5;
}

Assistant:

bool normalize_forward_slash(const char *path, char *dest)
{
	if (path == NULL || dest == NULL)
	{
		return false;
	}

	const char *p = path;
	char *q = dest;
	if (has_driveletter(path))
	{
		*q++ = *p++;
		*q++ = *p++;
	}
	if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
	{
		p++;
		*q++ = *G_FORWARD_SLASH_CHAR;
	}

	while (*p)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			while (step--)
			{
				*q++ = *p++;
			}
		}
		else if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			p++;
			*q++ = *G_FORWARD_SLASH_CHAR;
		}
		else
		{
			*q++ = *p++;
		}
	}
	*q = '\0';

	return true;
}